

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O0

int od_ec_dec_normalize(od_ec_dec *dec,od_ec_window dif,uint rng,int ret)

{
  int iVar1;
  byte bVar2;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  od_ec_dec *in_RDI;
  int d;
  
  iVar1 = get_msb(in_EDX);
  iVar1 = 0x10 - (iVar1 + 1);
  in_RDI->cnt = in_RDI->cnt - (short)iVar1;
  bVar2 = (byte)iVar1;
  in_RDI->dif = (in_ESI + 1 << (bVar2 & 0x1f)) - 1;
  in_RDI->rng = (uint16_t)(in_EDX << (bVar2 & 0x1f));
  if (in_RDI->cnt < 0) {
    od_ec_dec_refill(in_RDI);
  }
  return in_ECX;
}

Assistant:

static int od_ec_dec_normalize(od_ec_dec *dec, od_ec_window dif, unsigned rng,
                               int ret) {
  int d;
  assert(rng <= 65535U);
  /*The number of leading zeros in the 16-bit binary representation of rng.*/
  d = 16 - OD_ILOG_NZ(rng);
  /*d bits in dec->dif are consumed.*/
  dec->cnt -= d;
  /*This is equivalent to shifting in 1's instead of 0's.*/
  dec->dif = ((dif + 1) << d) - 1;
  dec->rng = rng << d;
  if (dec->cnt < 0) od_ec_dec_refill(dec);
  return ret;
}